

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

void GPU_UnsetImageVirtualResolution(GPU_Image *image)

{
  if (((_gpu_current_renderer != (GPU_Renderer *)0x0) && (image != (GPU_Image *)0x0)) &&
     (_gpu_current_renderer->current_context_target != (GPU_Target *)0x0)) {
    (*_gpu_current_renderer->impl->FlushBlitBuffer)(_gpu_current_renderer);
    image->w = image->base_w;
    image->h = image->base_h;
    image->using_virtual_resolution = false;
  }
  return;
}

Assistant:

void GPU_UnsetImageVirtualResolution(GPU_Image* image)
{
    if(_gpu_current_renderer == NULL || _gpu_current_renderer->current_context_target == NULL)
        return;

    if(image == NULL)
        return;

    GPU_FlushBlitBuffer();  // TODO: Perhaps move SetImageVirtualResolution into the renderer so we can check to see if this image is bound first.
    image->w = image->base_w;
    image->h = image->base_h;
    image->using_virtual_resolution = 0;
}